

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *r)

{
  size_t sVar1;
  size_t sVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l_00;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDX;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *extraout_RDX;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RSI;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDI;
  bool bVar4;
  uint roffs;
  uint loffs;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *out;
  uint outOffs;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_ffffffffffffff78;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_ffffffffffffff80;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff98;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *local_50;
  uint local_30;
  uint local_2c;
  uint local_1c;
  
  sVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size(in_RSI);
  if (sVar1 == 0) {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    sVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                      (in_RDX);
    if (sVar1 == 0) {
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      local_1c = 0;
      sVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                        (in_RSI);
      sVar2 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                        (in_RDX);
      local_50 = in_RDX;
      if (sVar1 <= sVar2) {
        local_50 = in_RSI;
      }
      local_2c = 0;
      local_30 = 0;
      while( true ) {
        l_00 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(ulong)local_2c;
        pMVar3 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                           (in_RSI);
        bVar4 = false;
        if (l_00 < pMVar3) {
          in_stack_ffffffffffffff98 =
               (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(ulong)local_30;
          pMVar3 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                             (in_RDX);
          bVar4 = in_stack_ffffffffffffff98 < pMVar3;
          pMVar3 = extraout_RDX;
        }
        if (!bVar4) break;
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                  (in_RSI,(ulong)local_2c);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                  (in_RDX,(ulong)local_30);
        bVar4 = Kernel::operator==(l_00,in_stack_ffffffffffffff98);
        if (bVar4) {
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                    (in_RSI,(ulong)local_2c);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                    (local_50,(ulong)local_1c);
          Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::operator=
                    ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                     in_stack_ffffffffffffff80,
                     (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                     in_stack_ffffffffffffff78);
          local_2c = local_2c + 1;
          local_30 = local_30 + 1;
          local_1c = local_1c + 1;
        }
        else {
          in_stack_ffffffffffffff80 =
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
               Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::
               operator[](in_RSI,(ulong)local_2c);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                    (in_RDX,(ulong)local_30);
          bVar4 = Kernel::operator<(l_00,in_stack_ffffffffffffff98);
          if (bVar4) {
            local_2c = local_2c + 1;
          }
          else {
            local_30 = local_30 + 1;
          }
        }
      }
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::truncate
                (local_50,(char *)(ulong)local_1c,(__off_t)pMVar3);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return in_RDI;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}